

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_openssl_bio.c
# Opt level: O0

int amqp_openssl_bio_read(BIO *b,char *out,int outl)

{
  int res_00;
  int iVar1;
  ssize_t sVar2;
  int in_EDX;
  void *in_RSI;
  BIO *in_RDI;
  int res;
  int fd;
  int flags;
  int local_1c;
  int local_18;
  int local_14;
  void *local_10;
  BIO *local_8;
  
  local_18 = 0x4000;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  BIO_ctrl(in_RDI,0x69,0,&local_1c);
  sVar2 = recv(local_1c,local_10,(long)local_14,local_18);
  res_00 = (int)sVar2;
  BIO_clear_flags(local_8,0xf);
  if (res_00 < 1) {
    iVar1 = amqp_openssl_bio_should_retry(res_00);
    if (iVar1 != 0) {
      BIO_set_flags(local_8,9);
    }
  }
  return res_00;
}

Assistant:

static int amqp_openssl_bio_read(BIO *b, char *out, int outl) {
  int flags = 0;
  int fd;
  int res;

#ifdef MSG_NOSIGNAL
  flags |= MSG_NOSIGNAL;
#endif

  BIO_get_fd(b, &fd);
  res = recv(fd, out, outl, flags);

  BIO_clear_retry_flags(b);
  if (res <= 0 && amqp_openssl_bio_should_retry(res)) {
    BIO_set_retry_read(b);
  }

  return res;
}